

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrViewStateFlags(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x10) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrViewStateFlags(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_VIEW_STATE_ORIENTATION_VALID_BIT) != 0) {
        // Clear the value XR_VIEW_STATE_ORIENTATION_VALID_BIT since it is valid
        int_value &= ~XR_VIEW_STATE_ORIENTATION_VALID_BIT;
    }
    if ((int_value & XR_VIEW_STATE_POSITION_VALID_BIT) != 0) {
        // Clear the value XR_VIEW_STATE_POSITION_VALID_BIT since it is valid
        int_value &= ~XR_VIEW_STATE_POSITION_VALID_BIT;
    }
    if ((int_value & XR_VIEW_STATE_ORIENTATION_TRACKED_BIT) != 0) {
        // Clear the value XR_VIEW_STATE_ORIENTATION_TRACKED_BIT since it is valid
        int_value &= ~XR_VIEW_STATE_ORIENTATION_TRACKED_BIT;
    }
    if ((int_value & XR_VIEW_STATE_POSITION_TRACKED_BIT) != 0) {
        // Clear the value XR_VIEW_STATE_POSITION_TRACKED_BIT since it is valid
        int_value &= ~XR_VIEW_STATE_POSITION_TRACKED_BIT;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}